

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint64_t farmhashna::HashLen0to16(char *s,size_t len)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = 0x9ae16a3b2f90404f;
  if (len < 8) {
    if (len < 4) {
      if (len != 0) {
        uVar5 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
        uVar1 = (uVar5 >> 0x2f ^ uVar5) * -0x651e95c4d06fbfb1;
      }
      return uVar1;
    }
    lVar4 = len * 2 + -0x651e95c4d06fbfb1;
    uVar5 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar4;
    uVar5 = (uVar5 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar5) * lVar4;
    uVar5 = uVar5 >> 0x2f ^ uVar5;
  }
  else {
    uVar5 = *(ulong *)(s + (len - 8));
    lVar4 = len * 2 + -0x651e95c4d06fbfb1;
    uVar2 = *(long *)s + 0x9ae16a3b2f90404f;
    uVar3 = ((uVar2 >> 0x19 | uVar2 << 0x27) + uVar5) * lVar4;
    uVar5 = ((uVar5 >> 0x25 | uVar5 << 0x1b) * lVar4 + uVar2 ^ uVar3) * lVar4;
    uVar5 = (uVar5 >> 0x2f ^ uVar3 ^ uVar5) * lVar4;
    uVar5 = uVar5 >> 0x2f ^ uVar5;
  }
  return uVar5 * lVar4;
}

Assistant:

STATIC_INLINE uint64_t HashLen0to16(const char *s, size_t len) {
  if (len >= 8) {
    uint64_t mul = k2 + len * 2;
    uint64_t a = Fetch(s) + k2;
    uint64_t b = Fetch(s + len - 8);
    uint64_t c = Rotate(b, 37) * mul + a;
    uint64_t d = (Rotate(a, 25) + b) * mul;
    return HashLen16(c, d, mul);
  }
  if (len >= 4) {
    uint64_t mul = k2 + len * 2;
    uint64_t a = Fetch32(s);
    return HashLen16(len + (a << 3), Fetch32(s + len - 4), mul);
  }
  if (len > 0) {
    uint8_t a = s[0];
    uint8_t b = s[len >> 1];
    uint8_t c = s[len - 1];
    uint32_t y = static_cast<uint32_t>(a) + (static_cast<uint32_t>(b) << 8);
    uint32_t z = len + (static_cast<uint32_t>(c) << 2);
    return ShiftMix(y * k2 ^ z * k0) * k2;
  }
  return k2;
}